

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void find_suite::find_if(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  reference piVar2;
  circular_view<int,_18446744073709551615UL> *pcVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  basic_iterator<int> local_a0;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  view_pointer local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> local_58;
  type local_38 [4];
  
  local_58.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_58.member.cap = 4;
  local_58.member.size = 0;
  local_58.member.next = 4;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_58,input);
  uVar1 = local_58.member.cap * 2;
  if ((uVar1 & local_58.member.cap * 2 - 1) == 0) {
    local_a0.current = local_58.member.next - local_58.member.size & uVar1 - 1;
    piVar5 = (int *)(uVar1 - 1 & local_58.member.next);
  }
  else {
    local_a0.current = (local_58.member.next - local_58.member.size) % uVar1;
    piVar5 = (int *)(local_58.member.next % uVar1);
  }
  lVar4 = (long)((long)piVar5 - local_a0.current) >> 2;
  local_a0.parent = &local_58;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_a0.parent;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_88);
      pcVar3 = local_a0.parent;
      piVar6 = (int *)local_a0.current;
      if (0x16 < *piVar2) goto LAB_001037e7;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_a0.parent;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_88);
      pcVar3 = local_a0.parent;
      piVar6 = (int *)local_a0.current;
      if (0x16 < *piVar2) goto LAB_001037e7;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_a0.parent;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_88);
      pcVar3 = local_a0.parent;
      piVar6 = (int *)local_a0.current;
      if (0x16 < *piVar2) goto LAB_001037e7;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_a0.parent;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_88);
      pcVar3 = local_a0.parent;
      piVar6 = (int *)local_a0.current;
      if (0x16 < *piVar2) goto LAB_001037e7;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)piVar5 - local_a0.current;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar3 = &local_58;
      piVar6 = piVar5;
      if (lVar4 != 3) goto LAB_001037e7;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_a0.parent;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_88);
      pcVar3 = local_a0.parent;
      piVar6 = (int *)local_a0.current;
      if (0x16 < *piVar2) goto LAB_001037e7;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
    }
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_a0.parent;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)local_a0.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       ((basic_iterator<int> *)&local_88);
    pcVar3 = local_a0.parent;
    piVar6 = (int *)local_a0.current;
    if (0x16 < *piVar2) goto LAB_001037e7;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
  }
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_a0.parent;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_a0.current;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_88);
  pcVar3 = local_a0.parent;
  piVar6 = (int *)local_a0.current;
  if (*piVar2 < 0x17) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_a0);
    pcVar3 = &local_58;
    piVar6 = piVar5;
  }
LAB_001037e7:
  local_a0.parent = (view_pointer)0x2c00000021;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l,&local_89);
  uVar1 = local_58.member.cap * 2;
  if ((uVar1 & local_58.member.cap * 2 - 1) == 0) {
    sStack_60 = uVar1 - 1 & local_58.member.next;
  }
  else {
    sStack_60 = local_58.member.next % uVar1;
  }
  local_68 = &local_58;
  first_end.current = sStack_60;
  first_end.parent = local_68;
  first_begin.current = (size_type)piVar6;
  first_begin.parent = pcVar3;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x13e,"void find_suite::find_if()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto where = std::find_if(span.begin(), span.end(), [](int value){ return value > 22; });
    {
        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}